

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::java::ClassNameResolver::HasConflictingClassName
          (ClassNameResolver *this,FileDescriptor *file,string *classname)

{
  pointer pcVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long *plVar7;
  Descriptor *message;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  
  uVar6 = (ulong)*(int *)(file + 0x68);
  bVar9 = 0 < (long)uVar6;
  if (0 < (long)uVar6) {
    plVar7 = *(long **)(file + 0x70);
    pcVar1 = (classname->_M_dataplus)._M_p;
    sVar2 = classname->_M_string_length;
    uVar8 = 1;
    do {
      sVar3 = ((undefined8 *)*plVar7)[1];
      if ((sVar3 == sVar2) &&
         ((sVar3 == 0 || (iVar4 = bcmp(*(void **)*plVar7,pcVar1,sVar3), iVar4 == 0)))) {
        if (bVar9) {
          return true;
        }
        break;
      }
      bVar9 = uVar8 < uVar6;
      plVar7 = plVar7 + 7;
      bVar10 = uVar8 != uVar6;
      uVar8 = uVar8 + 1;
    } while (bVar10);
  }
  uVar6 = (ulong)*(int *)(file + 0x78);
  bVar9 = 0 < (long)uVar6;
  if (0 < (long)uVar6) {
    plVar7 = *(long **)(file + 0x80);
    pcVar1 = (classname->_M_dataplus)._M_p;
    sVar2 = classname->_M_string_length;
    uVar8 = 1;
    do {
      sVar3 = ((undefined8 *)*plVar7)[1];
      if ((sVar3 == sVar2) &&
         ((sVar3 == 0 || (iVar4 = bcmp(*(void **)*plVar7,pcVar1,sVar3), iVar4 == 0)))) {
        if (bVar9) {
          return true;
        }
        break;
      }
      bVar9 = uVar8 < uVar6;
      plVar7 = plVar7 + 6;
      bVar10 = uVar8 != uVar6;
      uVar8 = uVar8 + 1;
    } while (bVar10);
  }
  uVar6 = (ulong)*(int *)(file + 0x58);
  bVar9 = 0 < (long)uVar6;
  if (0 < (long)uVar6) {
    message = *(Descriptor **)(file + 0x60);
    bVar10 = anon_unknown_0::MessageHasConflictingClassName(message,classname);
    if (!bVar10) {
      uVar8 = 1;
      do {
        uVar5 = uVar8;
        message = message + 0xa8;
        if (uVar6 == uVar5) break;
        bVar9 = anon_unknown_0::MessageHasConflictingClassName(message,classname);
        uVar8 = uVar5 + 1;
      } while (!bVar9);
      bVar9 = uVar5 < uVar6;
    }
  }
  return bVar9;
}

Assistant:

bool ClassNameResolver::HasConflictingClassName(
    const FileDescriptor* file, const string& classname) {
  for (int i = 0; i < file->enum_type_count(); i++) {
    if (file->enum_type(i)->name() == classname) {
      return true;
    }
  }
  for (int i = 0; i < file->service_count(); i++) {
    if (file->service(i)->name() == classname) {
      return true;
    }
  }
  for (int i = 0; i < file->message_type_count(); i++) {
    if (MessageHasConflictingClassName(file->message_type(i), classname)) {
      return true;
    }
  }
  return false;
}